

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O3

double time_oo<trng::xoshiro256plus>(xoshiro256plus *r)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  string res;
  string local_38;
  double local_18;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  uVar2 = (r->S).r[0];
  uVar5 = (r->S).r[1];
  uVar3 = (r->S).r[2];
  uVar4 = (r->S).r[3];
  dVar8 = 0.0;
  lVar6 = 0x1000000;
  do {
    uVar7 = uVar5 << 0x11;
    uVar3 = uVar3 ^ uVar2;
    uVar4 = uVar4 ^ uVar5;
    uVar5 = uVar5 ^ uVar3;
    uVar2 = uVar2 ^ uVar4;
    uVar3 = uVar3 ^ uVar7;
    uVar4 = uVar4 << 0x2d | uVar4 >> 0x13;
    dVar8 = dVar8 + (double)(uVar2 + uVar4 >> 1) * 1.084202172485504e-19 + 2.220446049250313e-16;
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
  (r->S).r[1] = uVar5;
  (r->S).r[0] = uVar2;
  (r->S).r[2] = uVar3;
  (r->S).r[3] = uVar4;
  lVar6 = std::chrono::_V2::system_clock::now();
  local_18 = 16.777216 / ((double)((lVar6 - lVar1) / 1000) * 1e-06);
  to_string<double>(&local_38,&local_18);
  while (local_38._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_38);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_38._M_dataplus._M_p,local_38._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return dVar8;
}

Assistant:

double time_oo(R &r) {
  double s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += trng::utility::uniformoo<double>(r);
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}